

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int verify_cert(ptls_verify_certificate_t *_self,ptls_t *tls,
               _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **verifier,void **verify_data,
               ptls_iovec_t *certs,size_t num_certs)

{
  X509_STORE *store;
  ptls_t *tls_00;
  int iVar1;
  int iVar2;
  int iVar3;
  stack_st_X509 *chain;
  X509 *x509;
  X509 *pXVar4;
  char *name;
  X509_STORE_CTX *ctx;
  size_t sVar5;
  EVP_PKEY *pEVar6;
  size_t *psVar7;
  long lVar8;
  uint8_t *p;
  uint8_t *local_58;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **local_50;
  void **local_48;
  ptls_verify_certificate_t *local_40;
  ptls_t *local_38;
  
  local_48 = verify_data;
  local_40 = _self;
  local_38 = tls;
  chain = (stack_st_X509 *)OPENSSL_sk_new_null();
  if (num_certs == 0) {
    __assert_fail("num_certs != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                  ,0x51c,
                  "int verify_cert(ptls_verify_certificate_t *, ptls_t *, int (**)(void *, ptls_iovec_t, ptls_iovec_t), void **, ptls_iovec_t *, size_t)"
                 );
  }
  local_58 = certs->base;
  x509 = d2i_X509((X509 **)0x0,&local_58,certs->len);
  iVar3 = 0x2a;
  if (x509 == (X509 *)0x0) goto LAB_0010c254;
  local_50 = verifier;
  if (num_certs != 1) {
    lVar8 = num_certs - 1;
    psVar7 = &certs[1].len;
    do {
      local_58 = ((ptls_iovec_t *)(psVar7 + -1))->base;
      pXVar4 = d2i_X509((X509 **)0x0,&local_58,*psVar7);
      if (pXVar4 == (X509 *)0x0) {
        iVar3 = 0x2a;
        goto LAB_0010c254;
      }
      OPENSSL_sk_push(chain,pXVar4);
      psVar7 = psVar7 + 2;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  tls_00 = local_38;
  store = (X509_STORE *)local_40[1].cb;
  iVar1 = ptls_is_server(local_38);
  name = ptls_get_server_name(tls_00);
  if (name == (char *)0x0) {
    __assert_fail("server_name != NULL && \"ptls_set_server_name MUST be called\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/openssl.c"
                  ,0x4cd,
                  "int verify_cert_chain(X509_STORE *, X509 *, struct stack_st_X509 *, int, const char *)"
                 );
  }
  ctx = X509_STORE_CTX_new();
  iVar3 = 0x201;
  if (ctx != (X509_STORE_CTX *)0x0) {
    iVar2 = X509_STORE_CTX_init(ctx,store,x509,chain);
    iVar3 = 0x203;
    if (iVar2 == 1) {
      X509_STORE_CTX_set_purpose(ctx,2 - (uint)(iVar1 == 0));
      iVar3 = X509_verify_cert(ctx);
      if (iVar3 == 1) {
        iVar3 = ptls_server_name_is_ipaddr(name);
        if (iVar3 == 0) {
          sVar5 = strlen(name);
          iVar1 = X509_check_host(x509,name,sVar5,4,0);
        }
        else {
          iVar1 = X509_check_ip_asc(x509,name,0);
        }
        iVar2 = 0x203;
        if (iVar1 == 0) {
          iVar2 = 0x2a;
        }
        iVar3 = 0;
        if (iVar1 != 1) {
          iVar3 = iVar2;
        }
      }
      else {
        iVar1 = X509_STORE_CTX_get_error(ctx);
        if (iVar1 < 0x11) {
          if (1 < iVar1 - 9U) {
            if (iVar1 == 2) goto switchD_0010c1a5_caseD_14;
            goto switchD_0010c1a5_caseD_12;
          }
          iVar3 = 0x2d;
        }
        else {
          iVar3 = 0x201;
          switch(iVar1) {
          case 0x11:
            break;
          case 0x12:
          case 0x13:
          case 0x15:
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
switchD_0010c1a5_caseD_12:
            iVar3 = 0x2e;
            break;
          case 0x14:
          case 0x1b:
          case 0x1c:
switchD_0010c1a5_caseD_14:
            iVar3 = 0x30;
            break;
          case 0x17:
            iVar3 = 0x2c;
            break;
          default:
            if (iVar1 != 0x4f) goto switchD_0010c1a5_caseD_12;
            iVar3 = 0x2a;
          }
        }
      }
    }
  }
  if (ctx != (X509_STORE_CTX *)0x0) {
    X509_STORE_CTX_free(ctx);
  }
  if (iVar3 == 0) {
    pEVar6 = X509_get_pubkey(x509);
    *local_48 = pEVar6;
    iVar3 = 0x2a;
    if (pEVar6 != (EVP_PKEY *)0x0) {
      *local_50 = verify_sign;
      iVar3 = 0;
    }
  }
LAB_0010c254:
  if (chain != (stack_st_X509 *)0x0) {
    OPENSSL_sk_pop_free(chain,X509_free);
  }
  if (x509 != (X509 *)0x0) {
    X509_free(x509);
  }
  return iVar3;
}

Assistant:

static int verify_cert(ptls_verify_certificate_t *_self, ptls_t *tls, int (**verifier)(void *, ptls_iovec_t, ptls_iovec_t),
                       void **verify_data, ptls_iovec_t *certs, size_t num_certs)
{
    ptls_openssl_verify_certificate_t *self = (ptls_openssl_verify_certificate_t *)_self;
    X509 *cert = NULL;
    STACK_OF(X509) *chain = sk_X509_new_null();
    size_t i;
    int ret = 0;

    assert(num_certs != 0);

    /* convert certificates to OpenSSL representation */
    if ((cert = to_x509(certs[0])) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    for (i = 1; i != num_certs; ++i) {
        X509 *interm = to_x509(certs[i]);
        if (interm == NULL) {
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            goto Exit;
        }
        sk_X509_push(chain, interm);
    }

    /* verify the chain */
    if ((ret = verify_cert_chain(self->cert_store, cert, chain, ptls_is_server(tls), ptls_get_server_name(tls))) != 0)
        goto Exit;

    /* extract public key for verifying the TLS handshake signature */
    if ((*verify_data = X509_get_pubkey(cert)) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    *verifier = verify_sign;

Exit:
    if (chain != NULL)
        sk_X509_pop_free(chain, X509_free);
    if (cert != NULL)
        X509_free(cert);
    return ret;
}